

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

int flatcc_builder_check_union_field(flatcc_builder_t *B,flatbuffers_voffset_t id)

{
  flatbuffers_voffset_t fVar1;
  flatbuffers_voffset_t *pfVar2;
  bool bVar3;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x514,
                  "int flatcc_builder_check_union_field(flatcc_builder_t *, flatbuffers_voffset_t)")
    ;
  }
  if ((id == 0) || (B->id_end <= id)) {
    bVar3 = false;
  }
  else {
    pfVar2 = B->vs;
    if ((ulong)pfVar2[id - 1] == 0) {
      fVar1 = pfVar2[id];
    }
    else {
      fVar1 = pfVar2[id];
      if (B->ds[pfVar2[id - 1]] != '\0') {
        bVar3 = fVar1 != 0;
        goto LAB_0011a25d;
      }
    }
    bVar3 = fVar1 == 0;
  }
LAB_0011a25d:
  return (int)bVar3;
}

Assistant:

int flatcc_builder_check_union_field(flatcc_builder_t *B, flatbuffers_voffset_t id)
{
    check(frame(type) == flatcc_builder_table, "expected table frame");

    if (id == 0 || id >= B->id_end) {
        return 0;
    }
    if (B->vs[id - 1] == 0) {
        return B->vs[id] == 0;
    }
    if (*(uint8_t *)(B->ds + B->vs[id - 1])) {
        return B->vs[id] != 0;
    }
    return B->vs[id] == 0;
}